

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O0

bool __thiscall cmake::IsAKnownSourceExtension(cmake *this,string_view ext)

{
  bool bVar1;
  bool local_71;
  cmake *this_local;
  string_view ext_local;
  
  bVar1 = FileExtensions::Test(&this->CLikeSourceFileExtensions,ext);
  local_71 = true;
  if (!bVar1) {
    bVar1 = FileExtensions::Test(&this->CudaFileExtensions,ext);
    local_71 = true;
    if (!bVar1) {
      bVar1 = FileExtensions::Test(&this->FortranFileExtensions,ext);
      local_71 = true;
      if (!bVar1) {
        bVar1 = FileExtensions::Test(&this->HipFileExtensions,ext);
        local_71 = true;
        if (!bVar1) {
          local_71 = FileExtensions::Test(&this->ISPCFileExtensions,ext);
        }
      }
    }
  }
  return local_71;
}

Assistant:

bool IsAKnownSourceExtension(cm::string_view ext) const
  {
    return this->CLikeSourceFileExtensions.Test(ext) ||
      this->CudaFileExtensions.Test(ext) ||
      this->FortranFileExtensions.Test(ext) ||
      this->HipFileExtensions.Test(ext) || this->ISPCFileExtensions.Test(ext);
  }